

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O2

void __thiscall OpenMD::NPT::moveB(NPT *this)

{
  pointer pVVar1;
  Thermo *this_00;
  int iVar2;
  Molecule *pMVar3;
  long lVar4;
  StuntDouble *pSVar5;
  long lVar6;
  pointer ppSVar7;
  ulong uVar8;
  RealType RVar9;
  pair<double,_double> pVar10;
  MoleculeIterator i;
  Vector3d sc;
  Vector3d frc;
  Vector3d vel;
  Vector3d ji;
  Vector3d Tb;
  long local_170;
  MoleculeIterator local_168;
  ulong local_160;
  pair<double,_double> *local_158;
  Thermo *local_150;
  double local_148;
  ulong local_140;
  Molecule *local_138;
  double local_130;
  pointer local_128;
  Vector<double,_3U> local_120;
  double local_108;
  undefined8 uStack_100;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_168._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_48);
  Vector<double,_3U>::Vector(&local_60);
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_90);
  pVar10 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_148 = pVar10.first;
  local_158 = &this->thermostat;
  this->thermostat = pVar10;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  pMVar3 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168);
  lVar4 = 0;
  while (pMVar3 != (Molecule *)0x0) {
    ppSVar7 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 ==
        (pMVar3->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar5 = (StuntDouble *)0x0;
    }
    else {
      pSVar5 = *ppSVar7;
    }
    lVar4 = (long)(int)lVar4;
    lVar6 = lVar4 * 0x18;
    while (ppSVar7 = ppSVar7 + 1, pSVar5 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_120,pSVar5);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)
                 ((long)(((this->oldVel).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar6),&local_120);
      if (pSVar5->objType_ - otDAtom < 2) {
        StuntDouble::getJ((Vector3d *)&local_120,pSVar5);
        Vector<double,_3U>::operator=
                  ((Vector<double,_3U> *)
                   ((long)(((this->oldJi).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                          data_ + lVar6),&local_120);
      }
      if (ppSVar7 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar5 = (StuntDouble *)0x0;
      }
      else {
        pSVar5 = *ppSVar7;
      }
      lVar6 = lVar6 + 0x18;
      lVar4 = lVar4 + 1;
    }
    pMVar3 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168);
  }
  local_150 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar9 = Thermo::getVolume(local_150);
  this->instaVol = RVar9;
  for (uVar8 = 0; this_00 = local_150, (int)uVar8 < this->maxIterNum_;
      uVar8 = (ulong)((int)uVar8 + 1)) {
    local_140 = uVar8;
    RVar9 = Thermo::getTemperature(local_150);
    this->instaTemp = RVar9;
    RVar9 = Thermo::getPressure(this_00);
    this->instaPress = RVar9;
    local_108 = (this->thermostat).first;
    uStack_100 = 0;
    (this->thermostat).first =
         ((this->instaTemp / this->targetTemp + -1.0) *
         (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 + local_148;
    (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x16])(this);
    (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
    pMVar3 = SimInfo::beginMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168);
    uVar8 = 0;
    while (pMVar3 != (Molecule *)0x0) {
      ppSVar7 = (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar7 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar5 = (StuntDouble *)0x0;
      }
      else {
        pSVar5 = *ppSVar7;
      }
      uVar8 = (ulong)(int)uVar8;
      local_170 = uVar8 * 0x18;
      local_138 = pMVar3;
      while (pSVar5 != (StuntDouble *)0x0) {
        local_128 = ppSVar7 + 1;
        StuntDouble::getFrc((Vector3d *)&local_120,pSVar5);
        Vector<double,_3U>::operator=(&local_90,&local_120);
        local_130 = pSVar5->mass_;
        local_160 = uVar8;
        (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x11])
                  (this,&local_d8,uVar8 & 0xffffffff);
        pVVar1 = (this->oldVel).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        operator*(&local_a8,
                  ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184) /
                  local_130,&local_90);
        OpenMD::operator+(&local_f0,
                          (Vector<double,_3U> *)
                          ((long)(pVVar1->super_Vector<double,_3U>).data_ + local_170),&local_a8);
        operator*(&local_c0,(this->super_VelocityVerletIntegrator).super_Integrator.dt2,&local_d8);
        operator-(&local_120,&local_f0,&local_c0);
        Vector3<double>::operator=((Vector3<double> *)&local_78,&local_120);
        StuntDouble::setVel(pSVar5,(Vector3d *)&local_78);
        if (pSVar5->objType_ - otDAtom < 2) {
          StuntDouble::getTrq((Vector3d *)&local_f0,pSVar5);
          StuntDouble::lab2Body((Vector3d *)&local_120,pSVar5,(Vector3d *)&local_f0);
          Vector<double,_3U>::operator=(&local_48,&local_120);
          pVVar1 = (this->oldJi).
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          operator*(&local_a8,
                    (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184,
                    &local_48);
          OpenMD::operator+(&local_f0,
                            (Vector<double,_3U> *)
                            ((long)(pVVar1->super_Vector<double,_3U>).data_ + local_170),&local_a8);
          operator*(&local_c0,
                    (this->super_VelocityVerletIntegrator).super_Integrator.dt2 *
                    (this->thermostat).first,
                    (Vector<double,_3U> *)
                    ((long)(((this->oldJi).
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                           data_ + local_170));
          operator-(&local_120,&local_f0,&local_c0);
          Vector3<double>::operator=((Vector3<double> *)&local_60,&local_120);
          StuntDouble::setJ(pSVar5,(Vector3d *)&local_60);
        }
        if (local_128 ==
            (local_138->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar5 = (StuntDouble *)0x0;
        }
        else {
          pSVar5 = *local_128;
        }
        local_170 = local_170 + 0x18;
        uVar8 = local_160 + 1;
        ppSVar7 = local_128;
      }
      pMVar3 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_168);
    }
    Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
    uVar8 = local_140;
    if (ABS(local_108 - (this->thermostat).first) <= this->chiTolerance) {
      iVar2 = (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x14])();
      if ((char)iVar2 != '\0') break;
    }
  }
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_158);
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    thermostat      = snap->getThermostat();
    RealType oldChi = thermostat.first;
    RealType prevChi;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:
    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve chi another half step using the temperature at t + dt/2
      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instaTemp / targetTemp - 1.0) / tt2;

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if ((fabs(prevChi - thermostat.first) <= chiTolerance) &&
          this->etaConverged())
        break;
    }

    // calculate integral of chidt
    thermostat.second += dt2 * thermostat.first;

    snap->setThermostat(thermostat);

    flucQ_->moveB();
    saveEta();
  }